

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadNodes<mapnode_t,mapsubsector_t>(MapData *map)

{
  ushort uVar1;
  ushort uVar2;
  FileReader *pFVar3;
  FileReader *pFVar4;
  _func_int *p_Var5;
  undefined1 auVar6 [16];
  long lVar7;
  node_t *pnVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ushort *__s;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  anon_union_32_2_9298864e_for_node_t_4 *paVar15;
  FMemLump FVar16;
  anon_union_32_2_9298864e_for_node_t_4 *paVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  undefined8 uStack_50;
  ushort auStack_48 [4];
  FMemLump local_40;
  FMemLump data;
  
  __s = auStack_48;
  uStack_50 = 0x53eaa8;
  FMemLump::FMemLump(&local_40);
  pFVar3 = map->MapLumps[7].Reader;
  uVar9 = 0;
  if (pFVar3 == (FileReader *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)(int)pFVar3->Length;
  }
  pFVar4 = map->MapLumps[6].Reader;
  if (pFVar4 != (FileReader *)0x0) {
    uVar9 = (uint)pFVar4->Length;
  }
  iVar19 = (int)(uVar11 / 0x1c);
  numnodes = iVar19;
  if ((uVar9 < 4) || (iVar19 == 0 && uVar9 >> 2 != 1)) {
    ForceNodeBuild = true;
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)iVar19;
    uVar13 = 0xffffffffffffffff;
    if (SUB168(auVar6 * ZEXT816(0x48),8) == 0) {
      uVar13 = SUB168(auVar6 * ZEXT816(0x48),0);
    }
    uStack_50 = 0x53eb29;
    nodes = (node_t *)operator_new__(uVar13);
    lVar7 = -((long)iVar19 * 2 + 0xfU & 0xfffffffffffffff0);
    __s = (ushort *)((long)auStack_48 + lVar7);
    *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53eb55;
    memset(__s,0,(long)iVar19 * 2);
    *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53eb5d;
    data.Block.Chars = (FString)operator_new__(uVar11);
    lVar14 = pFVar3->Length;
    map->file = pFVar3;
    p_Var5 = (pFVar3->super_FileReaderBase)._vptr_FileReaderBase[4];
    *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53eb7b;
    (*p_Var5)(pFVar3,0,0);
    FVar16 = data;
    pFVar3 = map->file;
    p_Var5 = (pFVar3->super_FileReaderBase)._vptr_FileReaderBase[2];
    *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53eb8f;
    (*p_Var5)(pFVar3,FVar16.Block.Chars,(long)(int)lVar14);
    if (0 < numnodes) {
      lVar14 = (long)data.Block.Chars + 8;
      paVar15 = &nodes->field_4;
      uVar11 = 0;
      pnVar8 = nodes;
      FVar16 = data;
      do {
        pnVar8->x = (uint)*(ushort *)FVar16.Block.Chars << 0x10;
        pnVar8->y = (uint)*(ushort *)((long)FVar16.Block.Chars + 2) << 0x10;
        pnVar8->dx = (uint)*(ushort *)((long)FVar16.Block.Chars + 4) << 0x10;
        pnVar8->dy = (uint)*(ushort *)((long)FVar16.Block.Chars + 6) << 0x10;
        paVar17 = paVar15;
        lVar18 = lVar14;
        uVar13 = 0;
        do {
          uVar1 = *(ushort *)((long)FVar16.Block.Chars + uVar13 * 2 + 0x18);
          uVar12 = (uint)uVar1;
          if (-1 < (short)uVar1) {
            if ((int)uVar12 < numnodes) {
              uVar2 = *(ushort *)((long)__s + (ulong)uVar12 * 2);
              if (uVar2 == 0) {
                *(ulong *)((long)&pnVar8->field_6 + uVar13 * 8) =
                     (long)&nodes->x + (ulong)(uVar12 * 0x48);
                *(short *)((long)__s + (ulong)uVar12 * 2) = (short)uVar13 + 1;
                goto LAB_0053ec54;
              }
              *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53ecf3;
              Printf("BSP node %d references node %d,\nwhich is already used by node %d.\nThe BSP will be rebuilt.\n"
                     ,uVar11,(ulong)uVar1,(ulong)(uVar2 - 1));
            }
            else {
              lVar14 = *(long *)((long)&pnVar8->field_6 + (uVar13 & 0xffffffff) * 8);
              *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53ece1;
              Printf("BSP node %d references invalid node %td.\nThe BSP will be rebuilt.\n",uVar11,
                     (lVar14 - (long)nodes >> 3) * -0x71c71c71c71c71c7);
            }
LAB_0053ed03:
            ForceNodeBuild = true;
            if (nodes != (node_t *)0x0) {
              *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53ed1b;
              operator_delete__(nodes);
            }
            goto LAB_0053ed1b;
          }
          if (uVar9 >> 2 <= (uVar12 & 0x7fff)) {
            *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53ed03;
            Printf("BSP node %d references invalid subsector %d.\nThe BSP will be rebuilt.\n");
            goto LAB_0053ed03;
          }
          *(ulong *)((long)&pnVar8->field_6 + uVar13 * 8) =
               (long)subsectors->portalcoverage + ((ulong)((uVar12 & 0x7fff) * 0x60) - 0x3f);
LAB_0053ec54:
          lVar10 = 0;
          do {
            *(float *)((long)paVar17 + lVar10 * 4) = (float)(int)*(short *)(lVar18 + lVar10 * 2);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          lVar18 = lVar18 + 8;
          paVar17 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar17 + 0x10);
          bVar20 = uVar13 == 0;
          uVar13 = uVar13 + 1;
        } while (bVar20);
        uVar12 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar12;
        pnVar8 = pnVar8 + 1;
        FVar16.Block.Chars = (FString)((long)FVar16.Block.Chars + 0x1c);
        lVar14 = lVar14 + 0x1c;
        paVar15 = (anon_union_32_2_9298864e_for_node_t_4 *)((long)paVar15 + 0x48);
      } while ((int)uVar12 < numnodes);
    }
LAB_0053ed1b:
    FVar16.Block.Chars = data.Block.Chars;
    *(undefined8 *)((long)auStack_48 + lVar7 + -8) = 0x53ed24;
    operator_delete__((void *)FVar16.Block.Chars);
  }
  *(undefined8 *)((long)__s + -8) = 0x53ed2d;
  FMemLump::~FMemLump(&local_40);
  return;
}

Assistant:

void P_LoadNodes (MapData * map)
{
	FMemLump	data;
	int 		i;
	int 		j;
	int 		k;
	char		*mnp;
	nodetype	*mn;
	node_t* 	no;
	WORD*		used;
	int			lumplen = map->Size(ML_NODES);
	int			maxss = map->Size(ML_SSECTORS) / sizeof(subsectortype);

	numnodes = (lumplen - nodetype::NF_LUMPOFFSET) / sizeof(nodetype);

	if ((numnodes == 0 && maxss != 1) || maxss == 0)
	{
		ForceNodeBuild = true;
		return;
	}
	
	nodes = new node_t[numnodes];		
	used = (WORD *)alloca (sizeof(WORD)*numnodes);
	memset (used, 0, sizeof(WORD)*numnodes);

	mnp = new char[lumplen];
	mn = (nodetype*)(mnp + nodetype::NF_LUMPOFFSET);
	map->Read(ML_NODES, mnp);
	no = nodes;
	
	for (i = 0; i < numnodes; i++, no++, mn++)
	{
		no->x = LittleShort(mn->x)<<FRACBITS;
		no->y = LittleShort(mn->y)<<FRACBITS;
		no->dx = LittleShort(mn->dx)<<FRACBITS;
		no->dy = LittleShort(mn->dy)<<FRACBITS;
		for (j = 0; j < 2; j++)
		{
			int child = mn->Child(j);
			if (child & nodetype::NF_SUBSECTOR)
			{
				child &= ~nodetype::NF_SUBSECTOR;
				if (child >= maxss)
				{
					Printf ("BSP node %d references invalid subsector %d.\n"
						"The BSP will be rebuilt.\n", i, child);
					ForceNodeBuild = true;
					delete[] nodes;
					delete[] mnp;
					return;
				}
				no->children[j] = (BYTE *)&subsectors[child] + 1;
			}
			else if (child >= numnodes)
			{
				Printf ("BSP node %d references invalid node %td.\n"
					"The BSP will be rebuilt.\n", i, (node_t *)no->children[j] - nodes);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else if (used[child])
			{
				Printf ("BSP node %d references node %d,\n"
					"which is already used by node %d.\n"
					"The BSP will be rebuilt.\n", i, child, used[child]-1);
				ForceNodeBuild = true;
				delete[] nodes;
				delete[] mnp;
				return;
			}
			else
			{
				no->children[j] = &nodes[child];
				used[child] = j + 1;
			}
			for (k = 0; k < 4; k++)
			{
				no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
			}
		}
	}
	delete[] mnp;
}